

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::add_thousands_sep<char>::operator()(add_thousands_sep<char> *this,char **buffer)

{
  uint uVar1;
  size_t sVar2;
  char *__last;
  char *pcVar3;
  long *in_RSI;
  basic_string_view<char> *in_RDI;
  char *p;
  
  uVar1 = *(int *)&in_RDI[1].data_ + 1;
  *(uint *)&in_RDI[1].data_ = uVar1;
  if (uVar1 % 3 == 0) {
    sVar2 = basic_string_view<char>::size(in_RDI);
    *in_RSI = *in_RSI - sVar2;
    __last = basic_string_view<char>::data(in_RDI);
    pcVar3 = basic_string_view<char>::data(in_RDI);
    sVar2 = basic_string_view<char>::size(in_RDI);
    pcVar3 = pcVar3 + sVar2;
    p = (char *)*in_RSI;
    sVar2 = basic_string_view<char>::size(in_RDI);
    make_checked<char>(p,sVar2);
    std::uninitialized_copy<char_const*,char*>(pcVar3,__last,p);
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_checked(buffer, sep_.size()));
  }